

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

int __thiscall
booster::locale::impl_icu::calendar_impl::get_value
          (calendar_impl *this,period_mark p,value_type type)

{
  Calendar *pCVar1;
  int iVar2;
  UCalendarDateFields UVar3;
  long lVar4;
  UErrorCode err;
  guard l;
  
  err = U_ZERO_ERROR;
  if (p == first_day_of_week) {
    std::unique_lock<std::mutex>::unique_lock(&l,&this->lock_);
    iVar2 = icu_70::Calendar::getFirstDayOfWeek((UErrorCode *)(this->calendar_).ptr_);
    goto LAB_00190780;
  }
  UVar3 = to_icu(p);
  std::unique_lock<std::mutex>::unique_lock(&l,&this->lock_);
  switch(type) {
  case absolute_minimum:
    lVar4 = 0x70;
    break;
  case actual_minimum:
    lVar4 = 0xa8;
    goto LAB_0019075a;
  case greatest_minimum:
    lVar4 = 0x90;
    break;
  case current:
    iVar2 = icu_70::Calendar::get
                      ((UCalendarDateFields)(this->calendar_).ptr_,(UErrorCode *)(ulong)UVar3);
    goto LAB_00190780;
  case least_maximum:
    lVar4 = 0xa0;
    break;
  case actual_maximum:
    lVar4 = 0xb0;
LAB_0019075a:
    pCVar1 = (this->calendar_).ptr_;
    iVar2 = (**(code **)(*(long *)pCVar1 + lVar4))(pCVar1,UVar3,&err);
    goto LAB_00190780;
  case absolute_maximum:
    lVar4 = 0x80;
    break;
  default:
    iVar2 = 0;
    goto LAB_00190780;
  }
  pCVar1 = (this->calendar_).ptr_;
  iVar2 = (**(code **)(*(long *)pCVar1 + lVar4))(pCVar1,UVar3);
LAB_00190780:
  std::unique_lock<std::mutex>::~unique_lock(&l);
  check_and_throw_dt(&err);
  return iVar2;
}

Assistant:

int get_value(period::marks::period_mark p,value_type type) const
        {
            UErrorCode err=U_ZERO_ERROR;
            int v=0;
            if(p==period::marks::first_day_of_week) {
                guard l(lock_);
                v=calendar_->getFirstDayOfWeek(err);
            }
            else {
                UCalendarDateFields uper=to_icu(p);
                guard l(lock_);
                switch(type) {
                case absolute_minimum:
                    v=calendar_->getMinimum(uper);
                    break;
                case actual_minimum:
                    v=calendar_->getActualMinimum(uper,err);
                    break;
                case greatest_minimum:
                    v=calendar_->getGreatestMinimum(uper);
                    break;
                case current:
                    v=calendar_->get(uper,err);
                    break;
                case least_maximum:
                    v=calendar_->getLeastMaximum(uper);
                    break;
                case actual_maximum:
                    v=calendar_->getActualMaximum(uper,err);
                    break;
                case absolute_maximum:
                    v=calendar_->getMaximum(uper);
                    break;
                }
            }
            check_and_throw_dt(err);
            return v;
        }